

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O1

void ObserverManager::unsubscribe<BaseObserverProtocol>(BaseObserverProtocol *observer)

{
  _Hash_node_base *p_Var1;
  __hash_code __code;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  id_t id;
  _Hash_node_base *local_10;
  
  if (observer != (BaseObserverProtocol *)0x0) {
    local_10 = (_Hash_node_base *)observer->observerId;
    p_Var2 = unsubscribeMap._M_h._M_buckets[(ulong)local_10 % unsubscribeMap._M_h._M_bucket_count];
    p_Var3 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var2->_M_nxt, p_Var3 = p_Var2, local_10 != p_Var2->_M_nxt[1]._M_nxt)) {
      while (p_Var2 = p_Var1, p_Var1 = p_Var2->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var3 = (__node_base_ptr)0x0;
        if (((ulong)p_Var1[1]._M_nxt % unsubscribeMap._M_h._M_bucket_count !=
             (ulong)local_10 % unsubscribeMap._M_h._M_bucket_count) ||
           (p_Var3 = p_Var2, local_10 == p_Var1[1]._M_nxt)) goto LAB_0012584f;
      }
      p_Var3 = (__node_base_ptr)0x0;
    }
LAB_0012584f:
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var1 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var1 = p_Var3->_M_nxt;
    }
    if (p_Var1 != (_Hash_node_base *)0x0) {
      if (p_Var1[2]._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)p_Var1[2]._M_nxt)();
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&unsubscribeMap._M_h,&local_10);
    }
  }
  return;
}

Assistant:

static void unsubscribe(P* observer) {
        if (observer == nullptr) {
            return;
        }

        auto id = observer->P::observerId;
        auto it = unsubscribeMap.find(id);
        if (it == std::end(unsubscribeMap)) {
            return;
        }

        auto ptr = it->second;
        if (ptr != nullptr) {
            ptr(observer);
        }

        unsubscribeMap.erase(id);
    }